

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

SessionID * __thiscall
FIX::Message::getSessionID(SessionID *__return_storage_ptr__,Message *this,string *qualifier)

{
  Header *this_00;
  TargetCompID targetCompID;
  SenderCompID senderCompID;
  BeginString beginString;
  FieldBase FStack_138;
  FieldBase local_d8;
  FieldBase local_78;
  
  BeginString::BeginString((BeginString *)&local_78);
  SenderCompID::SenderCompID((SenderCompID *)&local_d8);
  TargetCompID::TargetCompID((TargetCompID *)&FStack_138);
  this_00 = &this->m_header;
  FieldMap::getField(&this_00->super_FieldMap,&local_78);
  FieldMap::getField(&this_00->super_FieldMap,&local_d8);
  FieldMap::getField(&this_00->super_FieldMap,&FStack_138);
  SessionID::SessionID
            (__return_storage_ptr__,&local_78.m_string,&local_d8.m_string,&FStack_138.m_string,
             qualifier);
  FieldBase::~FieldBase(&FStack_138);
  FieldBase::~FieldBase(&local_d8);
  FieldBase::~FieldBase(&local_78);
  return __return_storage_ptr__;
}

Assistant:

SessionID Message::getSessionID( const std::string& qualifier ) const
EXCEPT ( FieldNotFound )
{
  BeginString beginString;
  SenderCompID senderCompID;
  TargetCompID targetCompID;

  getHeader().getField( beginString );
  getHeader().getField( senderCompID );
  getHeader().getField( targetCompID );

  return SessionID( beginString, senderCompID, targetCompID, qualifier );
}